

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muhash.cpp
# Opt level: O0

Num3072 * __thiscall MuHash3072::ToNum3072(MuHash3072 *this,Span<const_unsigned_char> in)

{
  Span<const_std::byte> key;
  Span<std::byte> output;
  Span<const_unsigned_char> *in_RDI;
  long in_FS_OFFSET;
  Num3072 *out;
  uint256 hashed_in;
  uchar tmp [384];
  HashWriter *in_stack_fffffffffffffd48;
  Num3072 *this_00;
  byte *pbVar1;
  undefined1 local_248 [32];
  ChaCha20Aligned *in_stack_fffffffffffffdd8;
  byte *in_stack_fffffffffffffde0;
  size_t sVar2;
  byte local_1a8 [416];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = 0;
  this_00 = (Num3072 *)&stack0xfffffffffffffde8;
  HashWriter::HashWriter(in_stack_fffffffffffffd48);
  HashWriter::operator<<((HashWriter *)this_00,in_RDI);
  pbVar1 = local_1a8;
  HashWriter::GetSHA256((HashWriter *)this_00);
  MakeByteSpan<uint256&>((uint256 *)this_00);
  key.m_size = (size_t)local_248;
  key.m_data = pbVar1;
  ChaCha20Aligned::ChaCha20Aligned((ChaCha20Aligned *)in_stack_fffffffffffffd48,key);
  MakeWritableByteSpan<unsigned_char(&)[384]>((uchar (*) [384])this_00);
  output.m_size = sVar2;
  output.m_data = in_stack_fffffffffffffde0;
  ChaCha20Aligned::Keystream(in_stack_fffffffffffffdd8,output);
  ChaCha20Aligned::~ChaCha20Aligned((ChaCha20Aligned *)in_stack_fffffffffffffd48);
  Num3072::Num3072(this_00,(uchar (*) [384])in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (Num3072 *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Num3072 MuHash3072::ToNum3072(Span<const unsigned char> in) {
    unsigned char tmp[Num3072::BYTE_SIZE];

    uint256 hashed_in{(HashWriter{} << in).GetSHA256()};
    static_assert(sizeof(tmp) % ChaCha20Aligned::BLOCKLEN == 0);
    ChaCha20Aligned{MakeByteSpan(hashed_in)}.Keystream(MakeWritableByteSpan(tmp));
    Num3072 out{tmp};

    return out;
}